

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

wchar_t mean(wchar_t *nums,wchar_t size,my_rational *frac)

{
  _Bool _Var1;
  uint16_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  my_rational mVar8;
  uint uVar9;
  ulong uVar10;
  uint16_t q [2];
  uint16_t sz [2];
  uint16_t r [4];
  uint16_t sn [4];
  uint16_t sp [4];
  uint16_t w [3];
  
  if (size < L'\x01') {
    wVar3 = L'\0';
    if (frac != (my_rational *)0x0) {
      frac->n = 0;
      frac->d = 1;
    }
  }
  else {
    zer_u16n(sp,4);
    zer_u16n(sn,4);
    for (uVar10 = 0; (uint)size != uVar10; uVar10 = uVar10 + 1) {
      wVar3 = nums[uVar10];
      if (wVar3 != L'\0') {
        if (wVar3 < L'\x01') {
          _Var1 = ini_u16n(r,2,(wVar3 ^ 0x7fffffffU) + 0x80000001);
          if (_Var1) {
            __assert_fail("!over",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x59e,"int mean(const int *, int, struct my_rational *)");
          }
          uVar2 = addip_u16n(sn,r,4,2);
          if (uVar2 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x59f,"int mean(const int *, int, struct my_rational *)");
          }
        }
        else {
          _Var1 = ini_u16n(r,2,wVar3);
          if (_Var1) {
            __assert_fail("!over",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x59b,"int mean(const int *, int, struct my_rational *)");
          }
          uVar2 = addip_u16n(sp,r,4,2);
          if (uVar2 != 0) {
            __assert_fail("carry == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x59c,"int mean(const int *, int, struct my_rational *)");
          }
        }
      }
    }
    _Var1 = ini_u16n(sz,2,size);
    if (_Var1) {
      __assert_fail("!over",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x5a3,"int mean(const int *, int, struct my_rational *)");
    }
    wVar3 = cmp_u16n(sp,sn,4,4);
    if (wVar3 < L'\0') {
      subip_u16n(sn,sp,4,4);
      wVar3 = div_u16n(q,r,w,sn,sz,2,4,2);
      if (wVar3 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5a8,"int mean(const int *, int, struct my_rational *)");
      }
      sVar7 = msb_u16n(q,2);
      if (0x20 < sVar7) {
        __assert_fail("msb_u16n(q, N_ELEMENTS(q)) <= CHAR_BIT * sizeof(unsigned int)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5aa,"int mean(const int *, int, struct my_rational *)");
      }
      uVar5 = ext_u16n(q,2);
      if (0x80000000 < uVar5) {
        __assert_fail("result <= abs_int_min",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ac,"int mean(const int *, int, struct my_rational *)");
      }
      wVar3 = cmp_u16n(sz,r,2,4);
      if (wVar3 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ad,"int mean(const int *, int, struct my_rational *)");
      }
      uVar6 = ext_u16n(r,4);
      mVar8 = my_rational_construct(uVar6,size);
      uVar9 = mVar8.d;
      uVar6 = mVar8.n;
      if (frac == (my_rational *)0x0) {
        if (uVar9 + 1 >> 1 <= uVar6) {
          if ((int)uVar5 < 0) {
            __assert_fail("result < abs_int_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5c1,"int mean(const int *, int, struct my_rational *)");
          }
          uVar5 = uVar5 + 1;
        }
      }
      else {
        if (uVar6 == 0) {
          frac->n = 0;
        }
        else {
          if ((int)uVar5 < 0) {
            __assert_fail("result < abs_int_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5b6,"int mean(const int *, int, struct my_rational *)");
          }
          if (uVar9 < uVar6 || uVar9 - uVar6 == 0) {
            __assert_fail("f.n < f.d",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5b8,"int mean(const int *, int, struct my_rational *)");
          }
          uVar5 = uVar5 + 1;
          frac->n = uVar9 - uVar6;
        }
        frac->d = uVar9;
      }
      wVar3 = -uVar5;
    }
    else {
      subip_u16n(sp,sn,4,4);
      wVar3 = div_u16n(q,r,w,sp,sz,2,4,2);
      if (wVar3 != L'\0') {
        __assert_fail("i == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ca,"int mean(const int *, int, struct my_rational *)");
      }
      sVar7 = msb_u16n(q,2);
      if (0x20 < sVar7) {
        __assert_fail("msb_u16n(q, N_ELEMENTS(q)) <= CHAR_BIT * sizeof(unsigned int)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5cb,"int mean(const int *, int, struct my_rational *)");
      }
      wVar3 = ext_u16n(q,2);
      if (wVar3 < L'\0') {
        __assert_fail("result <= INT_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5cd,"int mean(const int *, int, struct my_rational *)");
      }
      wVar4 = cmp_u16n(sz,r,2,4);
      if (wVar4 < L'\x01') {
        __assert_fail("cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x5ce,"int mean(const int *, int, struct my_rational *)");
      }
      uVar5 = ext_u16n(r,4);
      mVar8 = my_rational_construct(uVar5,size);
      if (frac == (my_rational *)0x0) {
        if (mVar8.d + 1 >> 1 <= mVar8.n) {
          if (wVar3 == L'\x7fffffff') {
            __assert_fail("result < INT_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x5d5,"int mean(const int *, int, struct my_rational *)");
          }
          wVar3 = wVar3 + L'\x01';
        }
      }
      else {
        frac->n = mVar8.n;
        frac->d = mVar8.d;
      }
    }
  }
  return wVar3;
}

Assistant:

int mean(const int *nums, int size, struct my_rational *frac)
{
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
	/* Holds the absolute value of INT_MIN in an unsigned int. */
	unsigned int abs_int_min = (unsigned int)(-(INT_MIN + 1)) + 1;
	/*
	 * Store the positive constructions to sum(nums[i]) in sp and the
	 * negative contributions to sum(nums[i]) in sn.
	 */
	uint16_t sp[2 * MP_DIGITS], sn[2 * MP_DIGITS];
	uint16_t q[MP_DIGITS], r[2 * MP_DIGITS], w[MP_DIGITS + 1];
	uint16_t sz[MP_DIGITS];
	struct my_rational f;
	unsigned int result;
	int i;
	/*
	 * Avoid compiler warnings about set but unused variables when
	 * assertions are stripped.
	 */
#ifndef NDEBUG
	bool over;
#define CHECK_OVERFLOW(x) over = x; assert(!over)
	uint16_t carry;
#define CHECK_CARRY(x) carry = x; assert(carry == 0)
#else
#define CHECK_OVERFLOW(x) x
#define CHECK_CARRY(x) x
#endif

	if (size <= 0) {
		if (frac) {
			*frac = my_rational_construct(0, 1);
		}
		return 0;
	}

	zer_u16n(sp, N_ELEMENTS(sp));
	zer_u16n(sn, N_ELEMENTS(sn));

	for (i = 0; i < size; ++i) {
		uint16_t v[MP_DIGITS];

		if (nums[i] == 0) {
			continue;
		}
		if (nums[i] > 0) {
			CHECK_OVERFLOW(ini_u16n(v, N_ELEMENTS(v), nums[i]));
			CHECK_CARRY(addip_u16n(sp, v, N_ELEMENTS(sp), N_ELEMENTS(v)));
		} else if (nums[i] < 0) {
			CHECK_OVERFLOW(ini_u16n(v, N_ELEMENTS(v), abs_int_min - (unsigned int)(nums[i] - INT_MIN)));
			CHECK_CARRY(addip_u16n(sn, v, N_ELEMENTS(sn), N_ELEMENTS(v)));
		}
	}

	CHECK_OVERFLOW(ini_u16n(sz, N_ELEMENTS(sz), size));
	if (cmp_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn)) < 0) {
		subip_u16n(sn, sp, N_ELEMENTS(sn), N_ELEMENTS(sp));
		i = div_u16n(q, r, w, sn, sz, N_ELEMENTS(q), N_ELEMENTS(sn),
			N_ELEMENTS(sz));
		assert(i == 0);
		assert(msb_u16n(q, N_ELEMENTS(q))
			<= CHAR_BIT * sizeof(unsigned int));
		result = ext_u16n(q, N_ELEMENTS(q));
		assert(result <= abs_int_min);
		assert(cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0);
		f = my_rational_construct(ext_u16n(r, N_ELEMENTS(r)), size);
		if (frac) {
			/*
			 * Will be negating m, but the returned fraction must
			 * be non-negative so increment m and replace the
			 * fractional part with (size - remainder) / size.
			 */
			if (f.n > 0) {
				assert(result < abs_int_min);
				++result;
				assert(f.n < f.d);
				frac->n = f.d - f.n;
				frac->d = f.d;
			} else {
				*frac = f;
			}
		} else {
			/* Round to nearest. */
			if (f.n >= (f.d + 1) / 2) {
				assert(result < abs_int_min);
				++result;
			}
		}
		return (result == 0) ?
			0 : INT_MIN + (int)(abs_int_min - result);
	}
	subip_u16n(sp, sn, N_ELEMENTS(sp), N_ELEMENTS(sn));
	i = div_u16n(q, r, w, sp, sz, N_ELEMENTS(q), N_ELEMENTS(sp), N_ELEMENTS(sz));
	assert(i == 0);
	assert(msb_u16n(q, N_ELEMENTS(q)) <= CHAR_BIT * sizeof(unsigned int));
	result = ext_u16n(q, N_ELEMENTS(q));
	assert(result <= INT_MAX);
	assert(cmp_u16n(sz, r, N_ELEMENTS(sz), N_ELEMENTS(r)) > 0);
	f = my_rational_construct(ext_u16n(r, N_ELEMENTS(r)), size);
	if (frac) {
		*frac = f;
	} else {
		/* Round to nearest. */
		if (f.n >= (f.d + 1) / 2) {
			assert(result < INT_MAX);
			++result;
		}
	}

	return result;
#undef MP_DIGITS
#undef CHECK_OVERFLOW
#undef CHECK_CARRY
}